

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result-c.cpp
# Opt level: O3

void duckdb_destroy_result(duckdb_result *result)

{
  undefined8 *__ptr;
  bool *__ptr_00;
  long *plVar1;
  undefined8 *puVar2;
  idx_t iVar3;
  duckdb_column *pdVar4;
  ulong uVar5;
  idx_t iVar6;
  DuckDBResultData *result_data;
  
  pdVar4 = result->deprecated_columns;
  if (pdVar4 != (duckdb_column *)0x0) {
    if (result->deprecated_column_count != 0) {
      uVar5 = 0;
      do {
        pdVar4 = result->deprecated_columns;
        __ptr = (undefined8 *)pdVar4[uVar5].deprecated_data;
        __ptr_00 = pdVar4[uVar5].deprecated_nullmask;
        if (__ptr != (undefined8 *)0x0) {
          iVar6 = result->deprecated_row_count;
          if (pdVar4[uVar5].deprecated_type == DUCKDB_TYPE_VARCHAR) {
            if (iVar6 != 0) {
              iVar3 = 0;
              do {
                if ((void *)__ptr[iVar3] != (void *)0x0) {
                  free((void *)__ptr[iVar3]);
                }
                iVar3 = iVar3 + 1;
              } while (iVar6 != iVar3);
            }
          }
          else {
            puVar2 = __ptr;
            if (pdVar4[uVar5].deprecated_type == DUCKDB_TYPE_BLOB) {
              for (; iVar6 != 0; iVar6 = iVar6 - 1) {
                if ((void *)*puVar2 != (void *)0x0) {
                  free((void *)*puVar2);
                }
                puVar2 = puVar2 + 2;
              }
            }
          }
          free(__ptr);
        }
        if (__ptr_00 != (bool *)0x0) {
          free(__ptr_00);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < result->deprecated_column_count);
      pdVar4 = result->deprecated_columns;
    }
    free(pdVar4);
  }
  plVar1 = (long *)result->internal_data;
  if (plVar1 != (long *)0x0) {
    if ((long *)*plVar1 != (long *)0x0) {
      (**(code **)(*(long *)*plVar1 + 8))();
    }
    operator_delete(plVar1);
  }
  result->deprecated_error_message = (char *)0x0;
  result->internal_data = (void *)0x0;
  result->deprecated_rows_changed = 0;
  result->deprecated_columns = (duckdb_column *)0x0;
  result->deprecated_column_count = 0;
  result->deprecated_row_count = 0;
  return;
}

Assistant:

void duckdb_destroy_result(duckdb_result *result) {
	if (result->deprecated_columns) {
		for (idx_t i = 0; i < result->deprecated_column_count; i++) {
			DuckdbDestroyColumn(result->deprecated_columns[i], result->deprecated_row_count);
		}
		duckdb_free(result->deprecated_columns);
	}
	if (result->internal_data) {
		auto result_data = reinterpret_cast<duckdb::DuckDBResultData *>(result->internal_data);
		delete result_data;
	}
	memset(result, 0, sizeof(duckdb_result));
}